

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkItem.h
# Opt level: O2

void __thiscall
cmLinkImplItem::cmLinkImplItem
          (cmLinkImplItem *this,string *n,cmGeneratorTarget *t,cmListFileBacktrace *bt,
          bool fromGenex)

{
  std::__cxx11::string::string((string *)this,(string *)n);
  (this->super_cmLinkItem).Target = t;
  cmListFileBacktrace::cmListFileBacktrace(&this->Backtrace,bt);
  this->FromGenex = fromGenex;
  return;
}

Assistant:

cmLinkImplItem(std::string const& n,
                 cmGeneratorTarget const* t,
                 cmListFileBacktrace const& bt,
                 bool fromGenex):
    cmLinkItem(n, t), Backtrace(bt), FromGenex(fromGenex) {}